

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_protocol.cc
# Opt level: O1

session * __thiscall helix::parity::pmd_protocol::new_session(pmd_protocol *this,void *data)

{
  session *psVar1;
  
  psVar1 = (session *)operator_new(0x118);
  psVar1->_data = data;
  psVar1->_vptr_session = (_func_int **)&PTR__moldudp64_session_00122d20;
  pmd_handler::pmd_handler((pmd_handler *)(psVar1 + 1));
  psVar1[0xe]._data = (void *)0x0;
  psVar1[0xf]._vptr_session = (_func_int **)0x0;
  psVar1[0xd]._data = (void *)0x0;
  psVar1[0xe]._vptr_session = (_func_int **)0x0;
  psVar1[0xf]._data = (void *)0x1;
  *(undefined4 *)&psVar1[0x10]._vptr_session = 0;
  *(undefined1 *)&psVar1[0x11]._vptr_session = 0;
  return psVar1;
}

Assistant:

session* pmd_protocol::new_session(void *data)
{
    return new nasdaq::moldudp64_session<pmd_handler>(data);
}